

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall arealights::Application::onRender(Application *this)

{
  undefined8 uVar1;
  anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0 aVar2
  ;
  undefined1 uVar3;
  EArealightMethod EVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  ivec2 iVar8;
  pointer ppVar9;
  DeferredRenderingPipeline *pDVar10;
  ShaderProgram *pSVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  ivec2 iVar13;
  element_type *peVar14;
  PointLightCluster *this_00;
  LinearlyTransformedCosines *pLVar15;
  GroundTruth *pGVar16;
  anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2_0 aVar17;
  mat4 modelMatrix;
  mat4 viewMatrix_00;
  mat4 projectionMatrix;
  mat4 modelMatrix_00;
  mat4 viewMatrix_01;
  mat4 projectionMatrix_00;
  int y;
  anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2 *paVar18;
  long lVar19;
  Writer *pWVar20;
  long lVar21;
  ostream *this_01;
  tm *ptVar22;
  void *__dest;
  uint x;
  char *pcVar23;
  sockaddr *__addr;
  GLsizei GVar24;
  int __fd;
  FreeCamera *this_02;
  GLbitfield GVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  GLsizei GVar32;
  int i;
  long lVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  initializer_list<arealights::PolygonalLight> __l;
  initializer_list<arealights::PolygonalLight> __l_00;
  initializer_list<arealights::PolygonalLight> __l_01;
  _Put_time<char> __f;
  float a;
  tmat4x4<float,_(glm::precision)0> projMatrix;
  time_t in_time_t;
  tmat4x4<float,_(glm::precision)0> Result_2;
  tmat4x4<float,_(glm::precision)0> Result_4;
  tmat4x4<float,_(glm::precision)0> lightWorldMatrix;
  mat4 viewMatrix;
  stringstream ss;
  tmat4x4<float,_(glm::precision)0> Result_3;
  tmat4x4<float,_(glm::precision)0> Result_1;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_4d8;
  undefined4 local_4c8;
  undefined4 uStack_4c4;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  long local_498;
  long local_490;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined4 local_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_448;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_438;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_408;
  long local_3f8;
  long lStack_3f0;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  tmat4x4<float,_(glm::precision)0> local_3c0;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_380 [2];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> local_340;
  vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> local_328;
  vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_> local_310;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_2f8;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_2e8;
  char *local_2d8;
  undefined2 local_2d0;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_2c8;
  Logger *local_2b8;
  char *local_2b0;
  DispatchAction local_2a8;
  pointer local_2a0;
  pointer pbStack_298;
  pointer local_290;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_288;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 auStack_258 [20];
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 aStack_244;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 aStack_234;
  undefined4 uStack_224;
  pointer local_220;
  ios_base local_208 [272];
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_f8;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_b8;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_70 [2];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  paVar18 = &fw::OpenGLApplication::getFramebufferSize((OpenGLApplication *)this)->field_0;
  iVar8.field_0 =
       (anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2)
       *(anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2 *)&paVar18->field_0;
  x = iVar8.field_0._0_4_;
  y = iVar8.field_0._4_4_;
  lVar19 = std::chrono::_V2::system_clock::now();
  this_02 = (this->_camera).super___shared_ptr<fw::FreeCamera,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  fw::FreeCamera::getViewMatrix((mat4 *)&local_380[0].field_0,this_02);
  __fd = (int)this_02;
  fVar35 = (float)(int)x / (float)y + -1.1920929e-07;
  uVar34 = -(uint)(-fVar35 <= fVar35);
  if ((float)(~uVar34 & (uint)-fVar35 | (uint)fVar35 & uVar34) <= 0.0) {
    __assert_fail("abs(aspect - std::numeric_limits<T>::epsilon()) > static_cast<T>(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/glm/glm/gtc/matrix_transform.inl"
                  ,0x104,"tmat4x4<T, defaultp> glm::perspectiveRH(T, T, T, T) [T = float]");
  }
  local_4d8.field_0.x = 1.0 / (((float)(int)x / (float)y) * 0.41421357);
  local_4d8._8_8_ = 0;
  uStack_4c0 = 0;
  local_4b8 = 0;
  local_4a8 = 0;
  local_4d8.field_0.y = 0.0;
  local_4c8 = 0;
  uStack_4c4 = 0x401a8279;
  uStack_4b0 = 0xbf800000bf80419a;
  uStack_4a0 = 0xbe4d0148;
  DeferredRenderingPipeline::startGeometryPass
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl);
  (*glad_glEnable)(0xb71);
  local_488 = 0x3f800000;
  uStack_484 = 0;
  uStack_480 = 0;
  uStack_47c = 0;
  local_478 = 0;
  uStack_474 = 0x3f800000;
  uStack_470 = 0;
  local_468 = 0;
  uStack_460 = 0x3f800000;
  uStack_45c = 0;
  local_458 = 0;
  uStack_454 = 0;
  uStack_450 = 0;
  uStack_44c = 0x3f800000;
  modelMatrix.value[2].field_0._8_8_ = 0x3f800000;
  modelMatrix.value._0_40_ = ZEXT2440(CONCAT420(0x3f800000,ZEXT820(0x3f800000)));
  modelMatrix.value[3].field_0._0_8_ = 0;
  modelMatrix.value[3].field_0._8_8_ = 0x3f80000000000000;
  DeferredRenderingPipeline::setModelMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             modelMatrix);
  viewMatrix_00.value[0].field_0.field_0.z = (float)(int)local_380[0]._8_8_;
  viewMatrix_00.value[0].field_0._0_8_ = local_380[0]._0_8_;
  viewMatrix_00.value[0].field_0.field_0.w = (float)(int)((ulong)local_380[0]._8_8_ >> 0x20);
  viewMatrix_00.value[1].field_0.field_0.x = (float)(int)local_380[1]._0_8_;
  viewMatrix_00.value[1].field_0.field_0.y = (float)(int)((ulong)local_380[1]._0_8_ >> 0x20);
  viewMatrix_00.value[1].field_0.field_0.z = (float)(int)local_380[1]._8_8_;
  viewMatrix_00.value[1].field_0.field_0.w = (float)(int)((ulong)local_380[1]._8_8_ >> 0x20);
  viewMatrix_00.value[2].field_0._0_8_ = local_360;
  viewMatrix_00.value[2].field_0._8_8_ = uStack_358;
  viewMatrix_00.value[3].field_0._0_8_ = local_350;
  viewMatrix_00.value[3].field_0._8_8_ = uStack_348;
  DeferredRenderingPipeline::setViewMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             viewMatrix_00);
  projectionMatrix.value[0].field_0.field_0.y = local_4d8.field_0.y;
  projectionMatrix.value[0].field_0.field_0.x = local_4d8.field_0.x;
  projectionMatrix.value[0].field_0.field_0.z = (float)(int)local_4d8._8_8_;
  projectionMatrix.value[0].field_0.field_0.w = (float)(int)((ulong)local_4d8._8_8_ >> 0x20);
  projectionMatrix.value[1].field_0.field_0.x = (float)local_4c8;
  projectionMatrix.value[1].field_0.field_0.y = (float)uStack_4c4;
  projectionMatrix.value[1].field_0.field_0.z = (float)(int)uStack_4c0;
  projectionMatrix.value[1].field_0.field_0.w = (float)(int)((ulong)uStack_4c0 >> 0x20);
  projectionMatrix.value[2].field_0._0_8_ = local_4b8;
  projectionMatrix.value[2].field_0._8_8_ = uStack_4b0;
  projectionMatrix.value[3].field_0._0_8_ = local_4a8;
  projectionMatrix.value[3].field_0._8_8_ = uStack_4a0;
  DeferredRenderingPipeline::setProjectionMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             projectionMatrix);
  DeferredRenderingPipeline::setMaterialID
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,0.1
            );
  ppVar9 = (this->_materialMap).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Material>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  Material::bind(ppVar9[(this->_interface)._activeMaterial].second.
                 super___shared_ptr<Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd,__addr,
                 (socklen_t)ppVar9);
  pDVar10 = (this->_deferredPipeline)._M_t.
            super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            ._M_t.
            super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl;
  pSVar11 = (pDVar10->_geometryPassShader).
            super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var12 = (pDVar10->_geometryPassShader).
            super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
    }
  }
  local_288._0_8_ = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"SolidMode","");
  fw::ShaderProgram::setUniform(pSVar11,(string *)&local_288,(this->_interface)._sceneRadio);
  if ((undefined1 *)local_288._0_8_ != local_278) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
  }
  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
  }
  pDVar10 = (this->_deferredPipeline)._M_t.
            super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            ._M_t.
            super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl;
  pSVar11 = (pDVar10->_geometryPassShader).
            super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var12 = (pDVar10->_geometryPassShader).
            super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
    }
  }
  local_288._0_8_ = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"MetalnessConst","");
  fw::ShaderProgram::setUniform(pSVar11,(string *)&local_288,(this->_interface)._metalness);
  if ((undefined1 *)local_288._0_8_ != local_278) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
  }
  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
  }
  pDVar10 = (this->_deferredPipeline)._M_t.
            super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            ._M_t.
            super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl;
  pSVar11 = (pDVar10->_geometryPassShader).
            super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var12 = (pDVar10->_geometryPassShader).
            super___shared_ptr<fw::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
    }
  }
  local_288._0_8_ = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"RoughnessConst","");
  fw::ShaderProgram::setUniform(pSVar11,(string *)&local_288,(this->_interface)._roughness);
  if ((undefined1 *)local_288._0_8_ != local_278) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
  }
  local_498 = lVar19;
  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
  }
  (*(((this->_planeMesh)._M_t.
      super___uniq_ptr_impl<fw::Mesh<fw::StandardVertex3D>,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_fw::Mesh<fw::StandardVertex3D>_*,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
      .super__Head_base<0UL,_fw::Mesh<fw::StandardVertex3D>_*,_false>._M_head_impl)->super_IMesh).
    _vptr_IMesh[3])();
  uVar1 = *(undefined8 *)&(this->_interface)._position.field_0;
  fVar36 = (float)uVar1;
  fVar37 = (float)((ulong)uVar1 >> 0x20);
  fVar35 = (this->_interface)._position.field_0.field_0.z;
  local_b8.field_0.x = 1.0;
  local_b8.field_0.y = 0.0;
  local_b8.field_0.z = 0.0;
  local_b8.field_0.w = 0.0;
  uStack_a8 = 0;
  uStack_a4 = 0x3f800000;
  uStack_a0 = 0;
  uStack_98 = 0;
  local_90 = 0x3f800000;
  uStack_8c = 0;
  fVar38 = fVar36 * 0.0;
  fVar40 = fVar37 * 0.0;
  fVar41 = fVar40 + fVar38;
  fVar39 = fVar35 * 0.0;
  fStack_88 = fVar36 + fVar40 + fVar39 + 0.0;
  fStack_84 = fVar37 + fVar38 + fVar39 + 0.0;
  fStack_80 = fVar35 + fVar41 + 0.0;
  fStack_7c = fVar39 + fVar41 + 1.0;
  fVar35 = (this->_interface)._rotation.field_0.field_0.x * 0.017453292;
  fVar36 = cosf(fVar35);
  fVar35 = sinf(fVar35);
  fVar41 = fVar36 + (1.0 - fVar36);
  fVar38 = (1.0 - fVar36) * 0.0;
  fVar39 = fVar35 * 0.0 + fVar38;
  fVar40 = fVar35 * -0.0 + fVar38;
  fVar38 = fVar38 * 0.0;
  fVar36 = fVar36 + fVar38;
  fVar43 = fVar41 * 0.0;
  fVar37 = fVar39 * 0.0;
  fVar44 = fVar43 + fVar37;
  fVar42 = fVar40 * 0.0;
  local_448._0_8_ = CONCAT44(fVar43 + fVar39 + fVar42,fVar41 + fVar37 + fVar42);
  local_448._8_8_ = CONCAT44(fVar44 + fVar42,fVar40 + fVar44);
  fVar43 = fVar36 * 0.0;
  fVar41 = (fVar38 + fVar35) * 0.0;
  local_438._0_8_ = CONCAT44(fVar36 + fVar42 + fVar41,fVar40 + fVar43 + fVar41);
  local_438._8_8_ = CONCAT44(fVar41 + fVar42 + fVar43,fVar38 + fVar35 + fVar42 + fVar43);
  fVar40 = (fVar38 - fVar35) * 0.0;
  fVar41 = fVar40 + fVar37;
  local_428 = CONCAT44((fVar38 - fVar35) + fVar37 + fVar43,fVar39 + fVar40 + fVar43);
  uStack_420 = CONCAT44(fVar41 + fVar43,fVar36 + fVar41);
  uStack_410 = 0x3f80000000000000;
  local_418 = 0;
  glm::operator*((tmat4x4<float,_(glm::precision)0> *)&local_2f8,
                 (tmat4x4<float,_(glm::precision)0> *)&local_b8.field_0,
                 (tmat4x4<float,_(glm::precision)0> *)&local_448.field_0);
  fVar35 = (this->_interface)._rotation.field_0.field_0.y * 0.017453292;
  fVar36 = cosf(fVar35);
  fVar35 = sinf(fVar35);
  fVar40 = (1.0 - fVar36) * 0.0;
  fVar38 = fVar35 * 0.0 + fVar40;
  fVar47 = fVar35 * -0.0 + fVar40;
  fVar40 = fVar40 * 0.0;
  fVar39 = fVar40 + fVar36;
  fVar36 = (1.0 - fVar36) + fVar36;
  fVar42 = fVar39 * 0.0;
  fVar37 = fVar38 * 0.0;
  fVar44 = fVar47 * 0.0;
  fVar45 = (fVar40 + fVar35) * 0.0;
  fVar46 = fVar45 + fVar44;
  fVar41 = (fVar40 - fVar35) * 0.0;
  local_f8._0_8_ = CONCAT44(fVar38 + fVar42 + fVar41,fVar39 + fVar37 + fVar41);
  local_f8._8_8_ = CONCAT44(fVar41 + fVar42 + fVar37,(fVar40 - fVar35) + fVar42 + fVar37);
  fVar41 = fVar36 * 0.0;
  fVar43 = fVar41 + fVar44;
  local_e8._0_8_ = CONCAT44(fVar36 + fVar44 + fVar37,fVar47 + fVar41 + fVar37);
  local_e8._8_8_ = CONCAT44(fVar43 + fVar37,fVar38 + fVar43);
  local_d8 = CONCAT44(fVar47 + fVar45 + fVar42,fVar40 + fVar35 + fVar44 + fVar42);
  uStack_d0 = CONCAT44(fVar46 + fVar42,fVar39 + fVar46);
  uStack_c0 = 0x3f80000000000000;
  local_c8 = 0;
  glm::operator*((tmat4x4<float,_(glm::precision)0> *)&local_288,
                 (tmat4x4<float,_(glm::precision)0> *)&local_2f8,
                 (tmat4x4<float,_(glm::precision)0> *)&local_f8.field_0);
  aVar2 = (this->_interface)._size.field_0.field_0;
  local_408.field_0.w = aVar2.x * 0.0;
  local_408.field_0.z = local_408.field_0.w;
  local_408._0_8_ = (ulong)aVar2 & 0xffffffff | (ulong)(uint)local_408.field_0.w << 0x20;
  local_3f8._0_4_ = aVar2.y * 0.0;
  local_3f8._4_4_ = aVar2.y;
  lStack_3f0 = (ulong)(uint)(float)local_3f8 * 0x100000001;
  local_3e8 = ZEXT816(0x3f800000) << 0x40;
  local_3d8 = ZEXT816(0x3f80000000000000) << 0x40;
  glm::operator*(&local_3c0,(tmat4x4<float,_(glm::precision)0> *)&local_288,
                 (tmat4x4<float,_(glm::precision)0> *)&local_408.field_0);
  local_b8.field_0.x = 0.99999994;
  local_b8.field_0.y = 0.0;
  local_b8.field_0.z = 0.0;
  local_b8.field_0.w = 0.0;
  uStack_a8 = 0;
  uStack_a4 = 0xb33bbd2e;
  uStack_a0 = 0x3f800000;
  uStack_98 = 0xbf80000000000000;
  local_90 = 0xb33bbd2e;
  uStack_8c = 0;
  fStack_88 = 0.0;
  fStack_84 = 0.0;
  fStack_80 = 0.0;
  fStack_7c = 1.0;
  pDVar10 = (this->_deferredPipeline)._M_t.
            super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            ._M_t.
            super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl;
  glm::operator*((tmat4x4<float,_(glm::precision)0> *)&local_70[0].field_0,&local_3c0,
                 (tmat4x4<float,_(glm::precision)0> *)&local_b8.field_0);
  modelMatrix_00.value[0].field_0.field_0.z = (float)(int)local_70[0]._8_8_;
  modelMatrix_00.value[0].field_0._0_8_ = local_70[0]._0_8_;
  modelMatrix_00.value[0].field_0.field_0.w = (float)(int)((ulong)local_70[0]._8_8_ >> 0x20);
  modelMatrix_00.value[1].field_0.field_0.x = (float)(int)local_70[1]._0_8_;
  modelMatrix_00.value[1].field_0.field_0.y = (float)(int)((ulong)local_70[1]._0_8_ >> 0x20);
  modelMatrix_00.value[1].field_0.field_0.z = (float)(int)local_70[1]._8_8_;
  modelMatrix_00.value[1].field_0.field_0.w = (float)(int)((ulong)local_70[1]._8_8_ >> 0x20);
  modelMatrix_00.value[2].field_0._0_8_ = local_50;
  modelMatrix_00.value[2].field_0._8_8_ = uStack_48;
  modelMatrix_00.value[3].field_0._0_8_ = local_40;
  modelMatrix_00.value[3].field_0._8_8_ = uStack_38;
  DeferredRenderingPipeline::setModelMatrix(pDVar10,modelMatrix_00);
  viewMatrix_01.value[0].field_0.field_0.z = (float)(int)local_380[0]._8_8_;
  viewMatrix_01.value[0].field_0._0_8_ = local_380[0]._0_8_;
  viewMatrix_01.value[0].field_0.field_0.w = (float)(int)((ulong)local_380[0]._8_8_ >> 0x20);
  viewMatrix_01.value[1].field_0.field_0.x = (float)(int)local_380[1]._0_8_;
  viewMatrix_01.value[1].field_0.field_0.y = (float)(int)((ulong)local_380[1]._0_8_ >> 0x20);
  viewMatrix_01.value[1].field_0.field_0.z = (float)(int)local_380[1]._8_8_;
  viewMatrix_01.value[1].field_0.field_0.w = (float)(int)((ulong)local_380[1]._8_8_ >> 0x20);
  viewMatrix_01.value[2].field_0._0_8_ = local_360;
  viewMatrix_01.value[2].field_0._8_8_ = uStack_358;
  viewMatrix_01.value[3].field_0._0_8_ = local_350;
  viewMatrix_01.value[3].field_0._8_8_ = uStack_348;
  DeferredRenderingPipeline::setViewMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             viewMatrix_01);
  projectionMatrix_00.value[0].field_0.field_0.y = local_4d8.field_0.y;
  projectionMatrix_00.value[0].field_0.field_0.x = local_4d8.field_0.x;
  projectionMatrix_00.value[0].field_0.field_0.z = (float)(int)local_4d8._8_8_;
  projectionMatrix_00.value[0].field_0.field_0.w = (float)(int)((ulong)local_4d8._8_8_ >> 0x20);
  projectionMatrix_00.value[1].field_0.field_0.x = (float)local_4c8;
  projectionMatrix_00.value[1].field_0.field_0.y = (float)uStack_4c4;
  projectionMatrix_00.value[1].field_0.field_0.z = (float)(int)uStack_4c0;
  projectionMatrix_00.value[1].field_0.field_0.w = (float)(int)((ulong)uStack_4c0 >> 0x20);
  projectionMatrix_00.value[2].field_0._0_8_ = local_4b8;
  projectionMatrix_00.value[2].field_0._8_8_ = uStack_4b0;
  projectionMatrix_00.value[3].field_0._0_8_ = local_4a8;
  projectionMatrix_00.value[3].field_0._8_8_ = uStack_4a0;
  DeferredRenderingPipeline::setProjectionMatrix
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,
             projectionMatrix_00);
  DeferredRenderingPipeline::setMaterialID
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl,0.3
            );
  (*(((this->_arealightMesh)._M_t.
      super___uniq_ptr_impl<fw::Mesh<fw::StandardVertex3D>,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_fw::Mesh<fw::StandardVertex3D>_*,_std::default_delete<fw::Mesh<fw::StandardVertex3D>_>_>
      .super__Head_base<0UL,_fw::Mesh<fw::StandardVertex3D>_*,_false>._M_head_impl)->super_IMesh).
    _vptr_IMesh[3])();
  DeferredRenderingPipeline::endGeometryPass
            ((this->_deferredPipeline)._M_t.
             super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             ._M_t.
             super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
             .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl);
  iVar13.field_0 =
       (anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2)
       *(anon_union_8_3_e2189aaa_for_tvec2<int,_(glm::precision)0>_2 *)
        &(((this->_deferredPipeline)._M_t.
           super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           ._M_t.
           super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
           .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl)->
         _resolution).field_0.field_0;
  EVar4 = (this->_interface)._selectedArealightMethod;
  (*glad_glBindFramebuffer)(0x8d40,this->_intermediateFBO);
  GVar32 = iVar13.field_0._0_4_;
  GVar24 = iVar13.field_0._4_4_;
  (*glad_glViewport)(0,0,GVar32,GVar24);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  if (EVar4 == AREALIGHT_GROUNDTRUTH) {
    if (this->_restartIncrementalRendering == true) {
      ((this->_groundTruth).super___shared_ptr<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->_numRender = 0;
      local_288._0_8_ = &PTR__Writer_001f9430;
      local_288.field_0.z = (float)0x80;
      local_278._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
      ;
      local_278._8_8_ = 0x197;
      local_268._0_4_ = 2.413867e-39;
      local_268._4_4_ = 0.0;
      local_268._8_2_ = 0;
      auStack_258._0_4_ = 0.0;
      auStack_258._4_4_ = 0.0;
      auStack_258._8_4_ = auStack_258._8_4_ & 0xffffff00;
      auStack_258._16_4_ = 0.0;
      aStack_244.field_0.x = 0.0;
      aStack_244.field_0.y = 2.589105e-39;
      aStack_244.field_0.z = 0.0;
      aStack_244.field_0.w = 2.8026e-45;
      aStack_234.field_0.y = 0.0;
      aStack_234.field_0.z = 0.0;
      aStack_234.field_0.w = 0.0;
      uStack_224 = 0;
      local_220 = (pointer)0x0;
      pWVar20 = el::base::Writer::construct((Writer *)&local_288,1,"framework");
      if (pWVar20->m_proceed == true) {
        el::base::MessageBuilder::operator<<
                  (&pWVar20->m_messageBuilder,"Restarting incremental rendering");
      }
      el::base::Writer::~Writer((Writer *)&local_288);
    }
    GVar25 = 0x100;
    if (this->_restartIncrementalRendering == true) goto LAB_0010fa02;
  }
  else {
LAB_0010fa02:
    this->_restartIncrementalRendering = false;
    GVar25 = 0x4100;
  }
  (*glad_glClear)(GVar25);
  pDVar10 = (this->_deferredPipeline)._M_t.
            super___uniq_ptr_impl<arealights::DeferredRenderingPipeline,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            ._M_t.
            super__Tuple_impl<0UL,_arealights::DeferredRenderingPipeline_*,_std::default_delete<arealights::DeferredRenderingPipeline>_>
            .super__Head_base<0UL,_arealights::DeferredRenderingPipeline_*,_false>._M_head_impl;
  GVar5 = pDVar10->_gPosition;
  GVar6 = pDVar10->_gNormal;
  GVar7 = pDVar10->_gColor;
  (*glad_glBindFramebuffer)(0x8ca8,pDVar10->_gBuffer);
  (*glad_glBindFramebuffer)(0x8ca9,this->_intermediateFBO);
  (*glad_glBlitFramebuffer)(0,0,GVar32,GVar24,0,0,GVar32,GVar24,0x100,0x2600);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,GVar7);
  (*glad_glActiveTexture)(0x84c1);
  (*glad_glBindTexture)(0xde1,GVar6);
  (*glad_glActiveTexture)(0x84c2);
  (*glad_glBindTexture)(0xde1,GVar5);
  if (EVar4 == AREALIGHT_LTC) {
    pLVar15 = (this->_ltc).
              super___shared_ptr<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pLVar15->_flux = (this->_interface)._flux;
    LinearlyTransformedCosines::setCamera(pLVar15,(mat4 *)&local_380[0].field_0);
    pLVar15 = (this->_ltc).
              super___shared_ptr<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_288._0_8_ = (char **)0x0;
    local_288._8_8_ = 0;
    local_278._0_8_ = (char *)0x0;
    local_278._8_8_ = 0x3f8000003f800000;
    local_268._0_4_ = 1.0;
    local_268._4_4_ = (undefined4)local_3c0.value[0].field_0._0_8_;
    local_268._8_2_ = (undefined2)((ulong)local_3c0.value[0].field_0._0_8_ >> 0x20);
    local_268._10_2_ = (undefined2)((ulong)local_3c0.value[0].field_0._0_8_ >> 0x30);
    local_268._12_4_ = (undefined4)local_3c0.value[0].field_0._8_8_;
    auStack_258._0_4_ = (undefined4)((ulong)local_3c0.value[0].field_0._8_8_ >> 0x20);
    auStack_258._4_4_ = (undefined4)local_3c0.value[1].field_0._0_8_;
    auStack_258._8_4_ = (undefined4)((ulong)local_3c0.value[1].field_0._0_8_ >> 0x20);
    auStack_258._12_4_ = (undefined4)local_3c0.value[1].field_0._8_8_;
    auStack_258._16_4_ = (undefined4)((ulong)local_3c0.value[1].field_0._8_8_ >> 0x20);
    aStack_244.field_0.x = (float)local_3c0.value[2].field_0._0_8_;
    aStack_244.field_0.y = (float)((ulong)local_3c0.value[2].field_0._0_8_ >> 0x20);
    aStack_244.field_0.z = (float)local_3c0.value[2].field_0._8_8_;
    aStack_244.field_0.w = (float)((ulong)local_3c0.value[2].field_0._8_8_ >> 0x20);
    aStack_234.field_0.x = (float)local_3c0.value[3].field_0._0_8_;
    aStack_234.field_0.y = (float)((ulong)local_3c0.value[3].field_0._0_8_ >> 0x20);
    aStack_234.field_0.z = (float)local_3c0.value[3].field_0._8_8_;
    aStack_234.field_0.w = (float)((ulong)local_3c0.value[3].field_0._8_8_ >> 0x20);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_288;
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::vector
              (&local_310,__l_00,(allocator_type *)&local_2f8);
    LinearlyTransformedCosines::setLights(pLVar15,&local_310);
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
              (&local_310);
    if ((char **)local_288._0_8_ != (char **)0x0) {
      operator_delete((void *)local_288._0_8_,local_278._0_8_ - local_288._0_8_);
    }
    LinearlyTransformedCosines::render
              ((this->_ltc).
               super___shared_ptr<arealights::LinearlyTransformedCosines,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  else if (EVar4 == AREALIGHT_CLUSTER) {
    peVar14 = (this->_pointLightCluster).
              super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar14->_lightFlux = (this->_interface)._flux;
    (peVar14->_clusterSize).field_0 = (this->_interface)._clusterSize.field_0;
    PointLightCluster::setCamera
              ((this->_pointLightCluster).
               super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (mat4 *)&local_380[0].field_0,(mat4 *)&local_4d8.field_0);
    this_00 = (this->_pointLightCluster).
              super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_288._0_8_ = (char **)0x0;
    local_288._8_8_ = 0;
    local_278._0_8_ = (char *)0x0;
    local_278._8_8_ = 0x3f8000003f800000;
    local_268._0_4_ = 1.0;
    local_268._4_4_ = (undefined4)local_3c0.value[0].field_0._0_8_;
    local_268._8_2_ = (undefined2)((ulong)local_3c0.value[0].field_0._0_8_ >> 0x20);
    local_268._10_2_ = (undefined2)((ulong)local_3c0.value[0].field_0._0_8_ >> 0x30);
    local_268._12_4_ = (undefined4)local_3c0.value[0].field_0._8_8_;
    auStack_258._0_4_ = (undefined4)((ulong)local_3c0.value[0].field_0._8_8_ >> 0x20);
    auStack_258._4_4_ = (undefined4)local_3c0.value[1].field_0._0_8_;
    auStack_258._8_4_ = (undefined4)((ulong)local_3c0.value[1].field_0._0_8_ >> 0x20);
    auStack_258._12_4_ = (undefined4)local_3c0.value[1].field_0._8_8_;
    auStack_258._16_4_ = (undefined4)((ulong)local_3c0.value[1].field_0._8_8_ >> 0x20);
    aStack_244.field_0.x = (float)local_3c0.value[2].field_0._0_8_;
    aStack_244.field_0.y = (float)((ulong)local_3c0.value[2].field_0._0_8_ >> 0x20);
    aStack_244.field_0.z = (float)local_3c0.value[2].field_0._8_8_;
    aStack_244.field_0.w = (float)((ulong)local_3c0.value[2].field_0._8_8_ >> 0x20);
    aStack_234.field_0.x = (float)local_3c0.value[3].field_0._0_8_;
    aStack_234.field_0.y = (float)((ulong)local_3c0.value[3].field_0._0_8_ >> 0x20);
    aStack_234.field_0.z = (float)local_3c0.value[3].field_0._8_8_;
    aStack_234.field_0.w = (float)((ulong)local_3c0.value[3].field_0._8_8_ >> 0x20);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_288;
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::vector
              (&local_328,__l,(allocator_type *)&local_2f8);
    PointLightCluster::setLights(this_00,&local_328);
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
              (&local_328);
    if ((char **)local_288._0_8_ != (char **)0x0) {
      operator_delete((void *)local_288._0_8_,local_278._0_8_ - local_288._0_8_);
    }
    PointLightCluster::render
              ((this->_pointLightCluster).
               super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  else if (EVar4 == AREALIGHT_DISABLED) {
    renderClusters(this);
  }
  else if (EVar4 == AREALIGHT_GROUNDTRUTH) {
    aVar2 = (this->_interface)._size.field_0.field_0;
    pGVar16 = (this->_groundTruth).
              super___shared_ptr<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pGVar16->_radiosity = (this->_interface)._flux / (aVar2.y * aVar2.x);
    GroundTruth::setCamera(pGVar16,(mat4 *)&local_380[0].field_0,(mat4 *)&local_4d8.field_0);
    pGVar16 = (this->_groundTruth).
              super___shared_ptr<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_288._0_8_ = (char **)0x0;
    local_288._8_8_ = 0;
    local_278._0_8_ = (char *)0x0;
    local_278._8_8_ = 0x3f8000003f800000;
    local_268._0_4_ = 1.0;
    local_268._4_4_ = (undefined4)local_3c0.value[0].field_0._0_8_;
    local_268._8_2_ = (undefined2)((ulong)local_3c0.value[0].field_0._0_8_ >> 0x20);
    local_268._10_2_ = (undefined2)((ulong)local_3c0.value[0].field_0._0_8_ >> 0x30);
    local_268._12_4_ = (undefined4)local_3c0.value[0].field_0._8_8_;
    auStack_258._0_4_ = (undefined4)((ulong)local_3c0.value[0].field_0._8_8_ >> 0x20);
    auStack_258._4_4_ = (undefined4)local_3c0.value[1].field_0._0_8_;
    auStack_258._8_4_ = (undefined4)((ulong)local_3c0.value[1].field_0._0_8_ >> 0x20);
    auStack_258._12_4_ = (undefined4)local_3c0.value[1].field_0._8_8_;
    auStack_258._16_4_ = (undefined4)((ulong)local_3c0.value[1].field_0._8_8_ >> 0x20);
    aStack_244.field_0.x = (float)local_3c0.value[2].field_0._0_8_;
    aStack_244.field_0.y = (float)((ulong)local_3c0.value[2].field_0._0_8_ >> 0x20);
    aStack_244.field_0.z = (float)local_3c0.value[2].field_0._8_8_;
    aStack_244.field_0.w = (float)((ulong)local_3c0.value[2].field_0._8_8_ >> 0x20);
    aStack_234.field_0.x = (float)local_3c0.value[3].field_0._0_8_;
    aStack_234.field_0.y = (float)((ulong)local_3c0.value[3].field_0._0_8_ >> 0x20);
    aStack_234.field_0.z = (float)local_3c0.value[3].field_0._8_8_;
    aStack_234.field_0.w = (float)((ulong)local_3c0.value[3].field_0._8_8_ >> 0x20);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_288;
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::vector
              (&local_340,__l_01,(allocator_type *)&local_2f8);
    GroundTruth::setLights(pGVar16,&local_340);
    std::vector<arealights::PolygonalLight,_std::allocator<arealights::PolygonalLight>_>::~vector
              (&local_340);
    if ((char **)local_288._0_8_ != (char **)0x0) {
      operator_delete((void *)local_288._0_8_,local_278._0_8_ - local_288._0_8_);
    }
    GroundTruth::render((this->_groundTruth).
                        super___shared_ptr<arealights::GroundTruth,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  }
  (*glad_glBindFramebuffer)(0x8d40,0);
  (*glad_glViewport)(0,0,x,y);
  (*glad_glClearColor)(0.007,0.11,0.15,1.0);
  (*glad_glClear)(0x4100);
  fw::ShaderProgram::use
            ((this->_blitSRGBProgram)._M_t.
             super___uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>._M_t.
             super__Tuple_impl<0UL,_fw::ShaderProgram_*,_std::default_delete<fw::ShaderProgram>_>.
             super__Head_base<0UL,_fw::ShaderProgram_*,_false>._M_head_impl);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,this->_intermediateFBOTexture);
  pSVar11 = (this->_blitSRGBProgram)._M_t.
            super___uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>._M_t.
            super__Tuple_impl<0UL,_fw::ShaderProgram_*,_std::default_delete<fw::ShaderProgram>_>.
            super__Head_base<0UL,_fw::ShaderProgram_*,_false>._M_head_impl;
  local_288._0_8_ = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"TargetTexture","");
  fw::ShaderProgram::setUniform(pSVar11,(string *)&local_288,0);
  lVar19 = local_498;
  if ((undefined1 *)local_288._0_8_ != local_278) {
    operator_delete((void *)local_288._0_8_,(ulong)(local_278._0_8_ + 1));
  }
  RenderHelper::drawFullScreenQuad
            ((this->_renderHelper).
             super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  lVar21 = std::chrono::_V2::system_clock::now();
  fVar35 = ((float)(lVar21 - lVar19) / 1e+09) * 1000.0;
  this->_frameTimeMs = fVar35;
  lVar19 = this->_frame * -0x3333333333333333;
  if ((lVar19 + 0x1999999999999998U >> 2 | lVar19 << 0x3e) < 0xccccccccccccccd) {
    (this->_interface)._renderTimeMs = fVar35;
  }
  if (this->_screenshotRequested != true) goto LAB_00110544;
  local_490 = std::chrono::_V2::system_clock::now();
  local_490 = local_490 / 1000000000;
  local_448._0_8_ = &local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448);
  switch((this->_interface)._selectedArealightMethod) {
  case AREALIGHT_DISABLED:
    pcVar23 = "disabled";
    break;
  case AREALIGHT_CLUSTER:
    std::__cxx11::stringstream::stringstream((stringstream *)&local_288);
    aVar17 = (((this->_pointLightCluster).
               super___shared_ptr<arealights::PointLightCluster,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_clusterSize).field_0.field_0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"point",5);
    this_01 = (ostream *)std::ostream::operator<<((ostream *)local_278,aVar17.x);
    std::__ostream_insert<char,std::char_traits<char>>(this_01,"x",1);
    std::ostream::operator<<((ostream *)this_01,aVar17.y);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_448.field_0,(string *)&local_2f8);
    if ((anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 *)local_2f8._0_8_ !=
        &local_2e8) {
      operator_delete((void *)local_2f8._0_8_,(ulong)(local_2e8._0_8_ + 1));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_288);
    std::ios_base::~ios_base(local_208);
    goto switchD_0010ffcc_default;
  case AREALIGHT_GROUNDTRUTH:
    pcVar23 = "gt";
    break;
  case AREALIGHT_LTC:
    pcVar23 = "ltc";
    break;
  default:
    goto switchD_0010ffcc_default;
  }
  std::__cxx11::string::_M_replace((ulong)&local_448,0,(char *)local_448._8_8_,(ulong)pcVar23);
switchD_0010ffcc_default:
  std::__cxx11::stringstream::stringstream((stringstream *)&local_288);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,(char *)local_448._0_8_,local_448._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"-flux-",6);
  std::ostream::_M_insert<double>((double)(this->_interface)._flux);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"-roughness-",0xb);
  std::ostream::_M_insert<double>((double)(this->_interface)._roughness);
  ptVar22 = localtime(&local_490);
  __f._M_fmt = "-%Y-%m-%d-%H-%M-%S";
  __f._M_tmb = (tm *)ptVar22;
  std::operator<<((ostream *)local_278,__f);
  if ((this->_screenshotAnnotation)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"-",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,(this->_screenshotAnnotation)._M_dataplus._M_p,
               (this->_screenshotAnnotation)._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,".png",4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_408.field_0,
             (long)(int)(x * 3 * y),(allocator_type *)&local_2f8);
  (*glad_glPixelStorei)(0xd05,1);
  (*glad_glReadPixels)(0,0,x,y,0x1907,0x1401,(void *)local_408._0_8_);
  uVar26 = local_408._8_8_ - local_408._0_8_;
  if (uVar26 == 0) {
    __dest = (void *)0x0;
  }
  else {
    if ((long)uVar26 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = operator_new(uVar26);
  }
  if (local_408._8_8_ - local_408._0_8_ != 0) {
    memmove(__dest,(void *)local_408._0_8_,local_408._8_8_ - local_408._0_8_);
  }
  if (1 < y) {
    lVar19 = (long)(int)x * 3;
    lVar21 = (((ulong)iVar8.field_0 >> 0x20) - 1) * lVar19;
    lVar27 = 0;
    uVar28 = 0;
    do {
      if (0 < (int)x) {
        uVar31 = 0;
        lVar29 = lVar27;
        lVar30 = lVar21;
        do {
          lVar33 = 0;
          do {
            uVar3 = *(undefined1 *)(lVar33 + local_408._0_8_ + lVar29);
            *(undefined1 *)(lVar33 + local_408._0_8_ + lVar29) =
                 *(undefined1 *)(lVar33 + local_408._0_8_ + lVar30);
            *(undefined1 *)(lVar33 + local_408._0_8_ + lVar30) = uVar3;
            lVar33 = lVar33 + 1;
          } while (lVar33 != 3);
          uVar31 = uVar31 + 1;
          lVar30 = lVar30 + 3;
          lVar29 = lVar29 + 3;
        } while (uVar31 != (x & 0x7fffffff));
      }
      uVar28 = uVar28 + 1;
      lVar21 = lVar21 + (long)(int)x * -3;
      lVar27 = lVar27 + lVar19;
    } while (uVar28 != (ulong)iVar8.field_0 >> 0x21);
  }
  std::__cxx11::stringbuf::str();
  stbi_write_png((char *)local_2f8._0_8_,x,y,3,(void *)local_408._0_8_,x * 3);
  if ((anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 *)local_2f8._0_8_ !=
      &local_2e8) {
    operator_delete((void *)local_2f8._0_8_,(ulong)(local_2e8._0_8_ + 1));
  }
  local_2f8._0_8_ = &PTR__Writer_001f9430;
  local_2f8.field_0.z = 1.79366e-43;
  local_2e8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
  ;
  local_2e8._8_8_ = 0x220;
  local_2d8 = "virtual void arealights::Application::onRender()";
  local_2d0 = 0;
  local_2c8._0_8_ = 0;
  local_2c8.data.data[8] = '\0';
  local_2b8 = (Logger *)0x0;
  local_2b0 = "";
  local_2a8 = NormalLog;
  local_2a0 = (pointer)0x0;
  pbStack_298 = (pointer)0x0;
  local_290 = (pointer)0x0;
  pWVar20 = el::base::Writer::construct((Writer *)&local_2f8,1,"framework");
  if (pWVar20->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar20->m_messageBuilder,"Screenshot saved in ");
  }
  std::__cxx11::stringbuf::str();
  if (pWVar20->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar20->m_messageBuilder,(char *)local_f8._0_8_);
  }
  if (pWVar20->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar20->m_messageBuilder," ");
  }
  if (pWVar20->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar20->m_messageBuilder,x);
  }
  if (pWVar20->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar20->m_messageBuilder,"x");
  }
  if (pWVar20->m_proceed == true) {
    el::base::MessageBuilder::operator<<(&pWVar20->m_messageBuilder,y);
  }
  if ((anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 *)local_f8._0_8_ != &local_e8)
  {
    operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
  }
  el::base::Writer::~Writer((Writer *)&local_2f8);
  this->_screenshotRequested = false;
  if (__dest != (void *)0x0) {
    operator_delete(__dest,uVar26);
  }
  if ((void *)local_408._0_8_ != (void *)0x0) {
    operator_delete((void *)local_408._0_8_,local_3f8 - local_408._0_8_);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_288);
  std::ios_base::~ios_base(local_208);
  if ((anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 *)local_448._0_8_ !=
      &local_438) {
    operator_delete((void *)local_448._0_8_,local_438._0_8_ + 1);
  }
LAB_00110544:
  fw::ImGuiApplication::onRender(&this->super_ImGuiApplication);
  fw::GenericKeyboardInput::nextFrame
            ((this->_keyboardInput).
             super___shared_ptr<fw::GenericKeyboardInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  fw::GenericMouseInput::nextFrame
            ((this->_mouseInput).
             super___shared_ptr<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

void Application::onRender()
{
    auto framebufferSize = getFramebufferSize();
    auto aspectRatio = static_cast<float>(framebufferSize.x) / framebufferSize.y;

    auto frameRenderingStart = std::chrono::high_resolution_clock::now();

    auto viewMatrix = _camera->getViewMatrix();
    auto projMatrix = glm::perspective(glm::radians(45.0f), aspectRatio, 0.1f, 100.0f);

    _deferredPipeline->startGeometryPass();

    glEnable(GL_DEPTH_TEST);

    _deferredPipeline->setModelMatrix({});
    _deferredPipeline->setViewMatrix(viewMatrix);
    _deferredPipeline->setProjectionMatrix(projMatrix);
    _deferredPipeline->setMaterialID(0.1f);

    _materialMap[_interface.getMaterialId()].second->bind();

    _deferredPipeline->getShader()->setUniform("SolidMode", _interface.getSceneId());
    _deferredPipeline->getShader()->setUniform("MetalnessConst", _interface.getMetalness());
    _deferredPipeline->getShader()->setUniform("RoughnessConst", _interface.getRoughness());

    _planeMesh->render();

    auto lightWorldMatrix = glm::translate({}, _interface.getPosition()) *
        glm::rotate(
            glm::mat4{},
            glm::radians(_interface.getRotation().x),
            glm::vec3{1.0f, 0.0f, 0.0f}
        ) *
        glm::rotate(
            glm::mat4{},
            glm::radians(_interface.getRotation().y),
            glm::vec3{0.0f, 1.0f, 0.0f}
        ) *
        glm::scale({}, glm::vec3{_interface.getSize(), 1.0f});

    auto planeUpMatrix = glm::rotate(glm::mat4{}, glm::radians(90.0f), glm::vec3{1.0f, 0.0f, 0.0f});
    _deferredPipeline->setModelMatrix(lightWorldMatrix * planeUpMatrix);
    _deferredPipeline->setViewMatrix(viewMatrix);
    _deferredPipeline->setProjectionMatrix(projMatrix);
    _deferredPipeline->setMaterialID(0.3f);
    _arealightMesh->render();

    _deferredPipeline->endGeometryPass();

    auto gbufferResolution = _deferredPipeline->getFramebufferSize();

    auto mode = _interface.getArealightMethod();

    glBindFramebuffer(GL_FRAMEBUFFER, _intermediateFBO);
    glViewport(0, 0, gbufferResolution.x, gbufferResolution.y);
    glClearColor(0.0f, 0.0f, 0.0f, 1.0f);

    GLbitfield clearMask = GL_DEPTH_BUFFER_BIT;

    const auto isIncremental = (mode == AREALIGHT_GROUNDTRUTH);

    if (mode == AREALIGHT_GROUNDTRUTH && _restartIncrementalRendering) {
        _groundTruth->restartIncrementalRendering();
        LOG(INFO) << "Restarting incremental rendering";
    }

    if (!isIncremental || _restartIncrementalRendering)
    {
        clearMask |= GL_COLOR_BUFFER_BIT;
        _restartIncrementalRendering = false;
    }

    glClear(clearMask);

    auto positionBuffer = _deferredPipeline->getPositionBuffer();
    auto normalBuffer = _deferredPipeline->getNormalBuffer();
    auto colorBuffer = _deferredPipeline->getColorBuffer();

    glBindFramebuffer(GL_READ_FRAMEBUFFER, _deferredPipeline->getFramebuffer());
    glBindFramebuffer(GL_DRAW_FRAMEBUFFER, _intermediateFBO);

    glBlitFramebuffer(
        0, 0, gbufferResolution.x, gbufferResolution.y,
        0, 0, gbufferResolution.x, gbufferResolution.y,
        GL_DEPTH_BUFFER_BIT,
        GL_NEAREST
    );

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, colorBuffer);

    glActiveTexture(GL_TEXTURE1);
    glBindTexture(GL_TEXTURE_2D, normalBuffer);

    glActiveTexture(GL_TEXTURE2);
    glBindTexture(GL_TEXTURE_2D, positionBuffer);

    if (mode == AREALIGHT_DISABLED)
    {
        renderClusters();
    }
    else if (mode == AREALIGHT_LTC)
    {
        _ltc->setFlux(_interface.getFlux());
        _ltc->setCamera(viewMatrix);
        _ltc->setLights({{{1.0f, 1.0f, 1.0f}, lightWorldMatrix}});
        _ltc->render();
    }
    else if (mode == AREALIGHT_CLUSTER)
    {
        _pointLightCluster->setLightFlux(_interface.getFlux());
        _pointLightCluster->setClusterSize(_interface.getClusterSize());
        _pointLightCluster->setCamera(viewMatrix, projMatrix);
        _pointLightCluster->setLights({{{1.0f, 1.0f, 1.0f}, lightWorldMatrix}});
        _pointLightCluster->render();
    }
    else if (mode == AREALIGHT_GROUNDTRUTH)
    {
        auto lightSize = _interface.getSize();
        auto lightArea = lightSize.x * lightSize.y;
        _groundTruth->setRadiosity(_interface.getFlux() / lightArea);
        _groundTruth->setCamera(viewMatrix, projMatrix);
        _groundTruth->setLights({{{1.0f, 1.0f, 1.0f}, lightWorldMatrix}});
        _groundTruth->render();
    }

    glBindFramebuffer(GL_FRAMEBUFFER, 0);
    glViewport(0, 0, framebufferSize.x, framebufferSize.y);
    glClearColor(0.007f, 0.11f, 0.15f, 1.0f);
    glClear(GL_DEPTH_BUFFER_BIT | GL_COLOR_BUFFER_BIT);

    _blitSRGBProgram->use();

    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, _intermediateFBOTexture);
    _blitSRGBProgram->setUniform("TargetTexture", 0);

    _renderHelper->drawFullScreenQuad();

    auto frameRenderingEnd = std::chrono::high_resolution_clock::now();
    _frameTimeMs = std::chrono::duration<float>(frameRenderingEnd - frameRenderingStart).count() * 1000;

    if (_frame % 20 == 0) {
        _interface.setRenderTimeMs(_frameTimeMs);
    }

    if (_screenshotRequested) {
        auto now = std::chrono::system_clock::now();
        auto in_time_t = std::chrono::system_clock::to_time_t(now);

        std::string methodName = "";
        switch (_interface.getArealightMethod()) {
        case AREALIGHT_DISABLED:
            methodName = "disabled";
            break;
        case AREALIGHT_CLUSTER:
        {
            std::stringstream ss;
            auto clusterSize = _pointLightCluster->getClusterSize();
            ss << "point" << clusterSize.x << "x" << clusterSize.y;
            methodName = ss.str();
            break;
        }
        case AREALIGHT_GROUNDTRUTH:
            methodName = "gt";
            break;
        case AREALIGHT_LTC:
            methodName = "ltc";
            break;
        }

        std::stringstream ss;
        ss << methodName;
        ss << "-flux-" << _interface.getFlux();
        ss << "-roughness-" << _interface.getRoughness();
        ss << std::put_time(std::localtime(&in_time_t), "-%Y-%m-%d-%H-%M-%S");
        if (_screenshotAnnotation.length() > 0) {
            ss << "-" << _screenshotAnnotation;
        }
        ss << ".png";

        int stride = 3 * sizeof(unsigned char) * framebufferSize.x;
        std::vector<unsigned char> data(3 * framebufferSize.x * framebufferSize.y);
        glPixelStorei(GL_PACK_ALIGNMENT, 1);
        glReadPixels(0, 0, framebufferSize.x, framebufferSize.y, GL_RGB, GL_UNSIGNED_BYTE, data.data());
        std::vector<unsigned char> orig = data;

        // We have to flip image to save it correctly.
        for (int y = 0; y < framebufferSize.y/2; ++y) {
            for (int x = 0; x < framebufferSize.x; ++x) {
                auto sourceBase = 3 * (framebufferSize.x * y + x);
                auto targetBase = 3 * (framebufferSize.x * (framebufferSize.y - y - 1) + x);
                for (int i = 0; i < 3; ++i) {
                    std::swap(data[sourceBase + i], data[targetBase + i]);
                }
            }
        }

        stbi_write_png(ss.str().c_str(), framebufferSize.x, framebufferSize.y, 3, data.data(), stride);

        LOG(INFO) << "Screenshot saved in " << ss.str() << " " << framebufferSize.x << "x" << framebufferSize.y;

        _screenshotRequested = false;
    }

    ImGuiApplication::onRender();

    // buffers are swapped after onRender by default

    _keyboardInput->nextFrame();
    _mouseInput->nextFrame();
}